

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order6o
              (sunrealtype *b,sunrealtype **A1,sunrealtype *c1,sunrealtype **A2,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  sunrealtype bAcAAc;
  
  b_00 = (sunrealtype *)calloc((long)s,8);
  b_01 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_mv(A3,c2,s,b_00);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A2,b_00,s,b_01), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_vv(c1,b_01,s,b_00), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_mv(A1,b_00,s,b_01), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(b,b_01,s,&bAcAAc);
    if (iVar1 != 0) {
      return 0;
    }
    free(b_00);
    free(b_01);
    return (uint)(ABS(bAcAAc + -0.005555555555555556) <= 1.4901161193847656e-08);
  }
  free(b_00);
  free(b_01);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6o(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype* c1, sunrealtype** A2,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bAcAAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAcAAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAcAAc - SUN_RCONST(1.0) / SUN_RCONST(180.0)) > TOL) ? SUNFALSE
                                                                       : SUNTRUE;
}